

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2-sse2.c
# Opt level: O0

void fill_segment_sse2(argon2_instance_t *instance,argon2_position_t position)

{
  argon2_instance_t *instance_local;
  argon2_position_t position_local;
  
  fill_segment_128(instance,position);
  return;
}

Assistant:

void fill_segment_sse2(const argon2_instance_t *instance,
                       argon2_position_t position)
{
    fill_segment_128(instance, position);
}